

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  runtime_error *this;
  long *plVar2;
  initializer_list<FBX::Process_*> __l;
  allocator_type local_1d3;
  less<FBX::Process_*> local_1d2;
  allocator<char> local_1d1;
  undefined1 local_1d0 [8];
  Process *local_1c8;
  string local_1c0;
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  local_1a0;
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  local_170;
  Parser parser;
  Decoder decoder;
  Node root;
  
  std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"Fox.fbx",&local_1d1);
  local_1c8 = (Process *)operator_new(8);
  local_1c8->_vptr_Process = (_func_int **)&PTR__Process_00116d38;
  __l._M_len = 1;
  __l._M_array = &local_1c8;
  std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::set
            ((set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> *)
             &local_1a0,__l,&local_1d2,&local_1d3);
  FBX::Decoder::Decoder(&decoder,&local_1c0);
  FBX::Decoder::readFile(&root,&decoder);
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::_Rb_tree(&local_170,&local_1a0);
  parser.root = &root;
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::_Rb_tree(&parser.processes._M_t,&local_170);
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::~_Rb_tree(&local_170);
  FBX::Parser::parseScene((Parser *)local_1d0);
  FBX::Parser::~Parser(&parser);
  FBX::Node::~Node(&root);
  FBX::Decoder::~Decoder(&decoder);
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::~_Rb_tree(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  plVar2 = *(long **)(*(long *)(**(long **)local_1d0 + 8) + 0x28);
  while( true ) {
    if (plVar2 == *(long **)(*(long *)(**(long **)local_1d0 + 8) + 0x30)) {
      std::chrono::_V2::system_clock::now();
      poVar1 = std::operator<<((ostream *)&std::cout,"Took ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1," milliseconds to read file");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_>::~unique_ptr
                ((unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> *)local_1d0);
      return 0;
    }
    if (plVar2[1] - *plVar2 != 0xc) break;
    plVar2 = plVar2 + 3;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&decoder.path,plVar2[1] - *plVar2 >> 2);
  std::runtime_error::runtime_error(this,(string *)&decoder);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char *argv[]) {
    auto t1 = std::chrono::high_resolution_clock::now();

    const auto &result = FBX::importFile("Fox.fbx", std::set<FBX::Process*>{new FBX::TriangulateProcess()});

    for (const auto &face : result->models[0]->mesh->faces)
        if (face.indices.size() != 3)
            throw std::runtime_error(std::to_string(face.indices.size()));

    auto t2 = std::chrono::high_resolution_clock::now();
    std::cout << "Took " << std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count()
              << " milliseconds to read file" << std::endl;

    // Use the mesh

    return EXIT_SUCCESS;
}